

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.h
# Opt level: O2

uint64_t Assimp::GetMeshHash(aiMesh *in)

{
  uint uVar1;
  
  if (in != (aiMesh *)0x0) {
    uVar1 = GetMeshVFormatUnique(in);
    return CONCAT44(uVar1,in->mPrimitiveTypes << 0x1c ^
                          in->mMaterialIndex << 0xf ^ in->mNumFaces << 4 ^
                          in->mNumBones << 0x10 ^ in->mNumVertices);
  }
  __assert_fail("nullptr != in",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/FindInstancesProcess.h"
                ,0x41,"uint64_t Assimp::GetMeshHash(aiMesh *)");
}

Assistant:

inline
uint64_t GetMeshHash(aiMesh* in) {
    ai_assert(nullptr != in);

    // ... get an unique value representing the vertex format of the mesh
    const unsigned int fhash = GetMeshVFormatUnique(in);

    // and bake it with number of vertices/faces/bones/matidx/ptypes
    return ((uint64_t)fhash << 32u) | ((
        (in->mNumBones << 16u) ^  (in->mNumVertices)       ^
        (in->mNumFaces<<4u)    ^  (in->mMaterialIndex<<15) ^
        (in->mPrimitiveTypes<<28)) & 0xffffffff );
}